

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_changed_ranges.c
# Opt level: O3

uint ts_subtree_get_changed_ranges
               (Subtree *old_tree,Subtree *new_tree,TreeCursor *cursor1,TreeCursor *cursor2,
               TSLanguage *language,TSRangeArray *included_range_differences,TSRange **ranges)

{
  uint *puVar1;
  SubtreeHeapData *pSVar2;
  bool bVar3;
  _Bool _Var4;
  _Bool _Var5;
  IteratorComparison IVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint32_t *puVar10;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  uint32_t goal_position;
  Length end;
  Length LVar20;
  Length LVar21;
  Length end_00;
  Length start;
  Length start_00;
  TSRangeArray results;
  Length result;
  Iterator new_iter;
  Iterator old_iter;
  uint32_t local_108;
  ulong local_100;
  TSRangeArray local_e8;
  ulong local_d8;
  int local_d0;
  int iStack_cc;
  uint local_c8;
  int local_c0;
  undefined4 uStack_bc;
  uint32_t local_b8;
  uint local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  Iterator local_a0;
  Subtree *local_78;
  Subtree *local_70;
  TreeCursor *local_68;
  TreeCursor *local_60;
  Iterator local_58;
  undefined8 uVar11;
  undefined8 uVar16;
  
  local_e8.contents = (TSRange *)0x0;
  local_e8.size = 0;
  local_e8.capacity = 0;
  local_78 = old_tree;
  local_68 = cursor1;
  iterator_new(&local_58,cursor1,old_tree,language);
  local_70 = new_tree;
  local_60 = cursor2;
  iterator_new(&local_a0,cursor2,new_tree,language);
  end = iterator_start_position(&local_58);
  LVar20 = iterator_start_position(&local_a0);
  uVar19 = LVar20._0_8_ & 0xffffffff;
  if (end.bytes < LVar20.bytes) {
    ts_range_array_add(&local_e8,end,LVar20);
    end = LVar20;
  }
  else if (LVar20.bytes < end.bytes) {
    ts_range_array_add(&local_e8,LVar20,end);
    uVar19 = end._0_8_ & 0xffffffff;
    LVar20 = end;
  }
  LVar21.extent.column = LVar20.extent.column;
  LVar21.bytes = (int)uVar19;
  LVar21.extent.row = (int)(uVar19 >> 0x20);
  local_100 = LVar20._0_8_ >> 0x20;
  uVar19 = 0;
  do {
    local_d8 = end._0_8_;
    IVar6 = iterator_compare(&local_58,&local_a0);
    uVar17 = (uint)uVar19;
    if (IVar6 == IteratorDiffers) {
      LVar20 = iterator_end_position(&local_58);
      LVar21 = iterator_end_position(&local_a0);
      if (LVar20.bytes < LVar21.bytes) {
        LVar21 = LVar20;
      }
LAB_00128b32:
      local_100 = LVar21._0_8_ >> 0x20;
      bVar3 = true;
    }
    else if (IVar6 == IteratorMatches) {
      LVar21 = iterator_end_position(&local_58);
      local_100 = LVar21._0_8_ >> 0x20;
      iVar7 = included_range_differences->size - uVar17;
      if (uVar17 <= included_range_differences->size && iVar7 != 0) {
        puVar10 = &included_range_differences->contents[uVar19].end_byte;
        do {
          if ((uint)local_d8 < *puVar10) {
            if (puVar10[-1] < LVar21.bytes) {
              local_100 = local_d8 >> 0x20;
              LVar21.extent.column = end.extent.column;
              LVar21.bytes = (int)(local_d8 & 0xffffffff);
              LVar21.extent.row = (int)((local_d8 & 0xffffffff) >> 0x20);
              goto LAB_00128aba;
            }
            break;
          }
          puVar10 = puVar10 + 6;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
LAB_00128b08:
      bVar3 = false;
    }
    else {
LAB_00128aba:
      goal_position = (uint32_t)local_d8;
      _Var4 = iterator_descend(&local_58,goal_position);
      _Var5 = iterator_descend(&local_a0,goal_position);
      if (_Var4) {
        if (_Var5) goto LAB_00128b08;
        LVar21 = iterator_end_position(&local_58);
        local_100 = LVar21._0_8_ >> 0x20;
        bVar3 = true;
      }
      else {
        if (_Var5) {
          LVar21 = iterator_end_position(&local_a0);
          goto LAB_00128b32;
        }
        LVar20 = iterator_end_position(&local_58);
        LVar21 = iterator_end_position(&local_a0);
        if (LVar20.bytes < LVar21.bytes) {
          LVar21 = LVar20;
        }
        local_100 = LVar21._0_8_ >> 0x20;
        bVar3 = false;
      }
    }
    while( true ) {
      local_108 = LVar21.extent.column;
      uVar8 = LVar21.bytes;
      if ((local_58.cursor.stack.size == 0) ||
         (LVar20 = iterator_end_position(&local_58), uVar8 < LVar20.bytes)) break;
      iterator_advance(&local_58);
    }
    while ((uVar15 = local_a0.visible_depth, local_a0.cursor.stack.size != 0 &&
           (LVar20 = iterator_end_position(&local_a0), uVar15 = local_a0.visible_depth,
           LVar20.bytes <= uVar8))) {
      iterator_advance(&local_a0);
    }
    while (uVar9 = local_58.visible_depth, uVar15 < local_58.visible_depth) {
      iterator_ascend(&local_58);
    }
    while (uVar9 < uVar15) {
      iterator_ascend(&local_a0);
      uVar15 = local_a0.visible_depth;
    }
    uVar14 = LVar21._0_8_ & 0xffffffff | local_100 << 0x20;
    if (bVar3) {
      LVar20.extent.column = local_108;
      LVar20.bytes = (int)uVar14;
      LVar20.extent.row = (int)(uVar14 >> 0x20);
      start.extent.column = end.extent.column;
      start.bytes = (int)local_d8;
      start.extent.row = (int)(local_d8 >> 0x20);
      ts_range_array_add(&local_e8,start,LVar20);
    }
    uVar15 = included_range_differences->size;
    uVar9 = uVar15;
    if (uVar15 < uVar17) {
      uVar9 = uVar17;
    }
    uVar18 = (ulong)(uVar17 - 1);
    end.extent.column = local_108;
    end.bytes = (int)uVar14;
    end.extent.row = (int)(uVar14 >> 0x20);
    lVar12 = uVar19 * 0x18 + 0x14;
    do {
      if (uVar15 <= uVar19) {
        uVar18 = (ulong)uVar9;
        break;
      }
      uVar19 = uVar19 + 1;
      uVar18 = (ulong)((int)uVar18 + 1);
      puVar1 = (uint *)((long)&(included_range_differences->contents->start_point).row + lVar12);
      lVar12 = lVar12 + 0x18;
    } while (*puVar1 <= uVar8);
    if ((local_58.cursor.stack.size == 0) || (uVar19 = uVar18, local_a0.cursor.stack.size == 0)) {
      pSVar2 = local_78->ptr;
      if (((ulong)pSVar2 & 1) == 0) {
        uVar19._0_4_ = (pSVar2->padding).bytes;
        uVar19._4_4_ = (pSVar2->padding).extent.row;
        uVar17 = (pSVar2->padding).extent.column;
        uVar14._0_4_ = (pSVar2->size).bytes;
        uVar14._4_4_ = (pSVar2->size).extent.row;
        uVar8 = (pSVar2->size).extent.column;
        iVar7 = uVar14._4_4_;
      }
      else {
        uVar17 = (uint)((ulong)pSVar2 >> 0x20) & 0xff;
        uVar19 = (ulong)pSVar2 >> 8 & 0xf00000000 | (ulong)((uint)((ulong)pSVar2 >> 0x10) & 0xff);
        uVar8 = (uint)pSVar2 >> 0x18;
        uVar14 = (ulong)uVar8;
        iVar7 = 0;
      }
      uStack_bc = (undefined4)(uVar19 >> 0x20);
      uVar15 = (int)uVar19 + (int)uVar14;
      uVar14 = CONCAT44(uVar17,uStack_bc) + CONCAT44(uVar8,iVar7);
      uVar19 = uVar14 & 0xffffffff | (ulong)uVar8 << 0x20;
      if (iVar7 == 0) {
        uVar19 = uVar14;
      }
      uStack_ac = (undefined4)uVar19;
      uVar16 = CONCAT44(uStack_ac,uVar15);
      uVar19 = uVar19 >> 0x20;
      pSVar2 = local_70->ptr;
      if (((ulong)pSVar2 & 1) == 0) {
        uVar18._0_4_ = (pSVar2->padding).bytes;
        uVar18._4_4_ = (pSVar2->padding).extent.row;
        local_b8 = (pSVar2->padding).extent.column;
        uVar13._0_4_ = (pSVar2->size).bytes;
        uVar13._4_4_ = (pSVar2->size).extent.row;
        local_c8 = (pSVar2->size).extent.column;
        iStack_cc = uVar13._4_4_;
      }
      else {
        local_b8 = (uint)((ulong)pSVar2 >> 0x20) & 0xff;
        uVar18 = (ulong)pSVar2 >> 8 & 0xf00000000 | (ulong)((uint)((ulong)pSVar2 >> 0x10) & 0xff);
        local_c8 = (uint)pSVar2 >> 0x18;
        iStack_cc = 0;
        uVar13 = (ulong)local_c8;
      }
      local_d0 = (int)uVar13;
      local_c0 = (int)uVar18;
      uStack_bc = (undefined4)(uVar18 >> 0x20);
      local_b0 = local_c0 + local_d0;
      uVar18 = CONCAT44(local_b8,uStack_bc) + CONCAT44(local_c8,iStack_cc);
      uVar14 = uVar18 & 0xffffffff | (ulong)local_c8 << 0x20;
      if (iStack_cc == 0) {
        uVar14 = uVar18;
      }
      uStack_ac = (undefined4)uVar14;
      uStack_a8 = (undefined4)(uVar14 >> 0x20);
      uVar11 = CONCAT44(uStack_ac,local_b0);
      uVar18 = uVar14 >> 0x20;
      if ((uVar15 < local_b0) ||
         (uVar11 = uVar16, uVar16 = CONCAT44(uStack_ac,local_b0), uVar18 = uVar19,
         uVar19 = uVar14 >> 0x20, local_b0 < uVar15)) {
        end_00.extent.column = (uint32_t)uVar18;
        end_00.bytes = (int)uVar11;
        end_00.extent.row = (int)((ulong)uVar11 >> 0x20);
        start_00.extent.column = (uint32_t)uVar19;
        start_00.bytes = (int)uVar16;
        start_00.extent.row = (int)((ulong)uVar16 >> 0x20);
        ts_range_array_add(&local_e8,start_00,end_00);
      }
      (local_68->stack).size = local_58.cursor.stack.size;
      (local_68->stack).capacity = local_58.cursor.stack.capacity;
      local_68->tree = local_58.cursor.tree;
      (local_68->stack).contents = local_58.cursor.stack.contents;
      (local_60->stack).size = local_a0.cursor.stack.size;
      (local_60->stack).capacity = local_a0.cursor.stack.capacity;
      local_60->tree = local_a0.cursor.tree;
      (local_60->stack).contents = local_a0.cursor.stack.contents;
      *ranges = local_e8.contents;
      return local_e8.size;
    }
  } while( true );
}

Assistant:

unsigned ts_subtree_get_changed_ranges(const Subtree *old_tree, const Subtree *new_tree,
                                       TreeCursor *cursor1, TreeCursor *cursor2,
                                       const TSLanguage *language,
                                       const TSRangeArray *included_range_differences,
                                       TSRange **ranges) {
  TSRangeArray results = array_new();

  Iterator old_iter = iterator_new(cursor1, old_tree, language);
  Iterator new_iter = iterator_new(cursor2, new_tree, language);

  unsigned included_range_difference_index = 0;

  Length position = iterator_start_position(&old_iter);
  Length next_position = iterator_start_position(&new_iter);
  if (position.bytes < next_position.bytes) {
    ts_range_array_add(&results, position, next_position);
    position = next_position;
  } else if (position.bytes > next_position.bytes) {
    ts_range_array_add(&results, next_position, position);
    next_position = position;
  }

  do {
    #ifdef DEBUG_GET_CHANGED_RANGES
    printf("At [%-2u, %-2u] Compare ", position.extent.row, position.extent.column);
    iterator_print_state(&old_iter);
    printf("\tvs\t");
    iterator_print_state(&new_iter);
    puts("");
    #endif

    bool is_changed = false;
    switch (iterator_compare(&old_iter, &new_iter)) {
      case IteratorMatches:
        next_position = iterator_end_position(&old_iter);
        if (ts_range_array_intersects(
          included_range_differences,
          included_range_difference_index,
          position.bytes, next_position.bytes
        )) {
          next_position = position;
          // fall through
        } else {
          break;
        }

      case IteratorMayDiffer:
        if (iterator_descend(&old_iter, position.bytes)) {
          if (!iterator_descend(&new_iter, position.bytes)) {
            is_changed = true;
            next_position = iterator_end_position(&old_iter);
          }
        } else if (iterator_descend(&new_iter, position.bytes)) {
          is_changed = true;
          next_position = iterator_end_position(&new_iter);
        } else {
          next_position = length_min(
            iterator_end_position(&old_iter),
            iterator_end_position(&new_iter)
          );
        }
        break;

      case IteratorDiffers:
        is_changed = true;
        next_position = length_min(
          iterator_end_position(&old_iter),
          iterator_end_position(&new_iter)
        );
        break;
    }

    while (
      !iterator_done(&old_iter) &&
      iterator_end_position(&old_iter).bytes <= next_position.bytes
    ) iterator_advance(&old_iter);

    while (
      !iterator_done(&new_iter) &&
      iterator_end_position(&new_iter).bytes <= next_position.bytes
    ) iterator_advance(&new_iter);

    while (old_iter.visible_depth > new_iter.visible_depth) iterator_ascend(&old_iter);

    while (new_iter.visible_depth > old_iter.visible_depth) iterator_ascend(&new_iter);

    if (is_changed) {
      #ifdef DEBUG_GET_CHANGED_RANGES
      printf(
        "  change: [[%u, %u] - [%u, %u]]\n",
        position.extent.row, position.extent.column,
        next_position.extent.row, next_position.extent.column
      );
      #endif

      ts_range_array_add(&results, position, next_position);
    }

    position = next_position;

    while (included_range_difference_index < included_range_differences->size) {
      const TSRange *range = &included_range_differences->contents[included_range_difference_index];
      if (range->end_byte <= position.bytes) {
        included_range_difference_index++;
      } else {
        break;
      }
    }
  } while (!iterator_done(&old_iter) && !iterator_done(&new_iter));

  Length old_size = ts_subtree_total_size(*old_tree);
  Length new_size = ts_subtree_total_size(*new_tree);
  if (old_size.bytes < new_size.bytes) {
    ts_range_array_add(&results, old_size, new_size);
  } else if (new_size.bytes < old_size.bytes) {
    ts_range_array_add(&results, new_size, old_size);
  }

  *cursor1 = old_iter.cursor;
  *cursor2 = new_iter.cursor;
  *ranges = results.contents;
  return results.size;
}